

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  VP8LBitReader *br_00;
  uint32_t *puVar8;
  uint32_t *puVar9;
  HTreeGroup *br_01;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  undefined4 *in_RDI;
  int in_R8D;
  code *in_R9;
  int key;
  int dist_symbol;
  int length;
  int length_sym;
  int dist;
  int dist_code;
  int alpha;
  int blue;
  int red;
  int code;
  HTreeGroup *htree_group;
  int mask;
  VP8LColorCache *color_cache;
  int next_sync_row;
  int color_cache_limit;
  int len_code_limit;
  uint32_t *src_last;
  uint32_t *src_end;
  uint32_t *last_cached;
  uint32_t *src;
  VP8LMetadata *hdr;
  VP8LBitReader *br;
  int col;
  int row;
  int in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  VP8LDecoder *in_stack_ffffffffffffff20;
  VP8LBitReader *in_stack_ffffffffffffff28;
  HTreeGroup *cc;
  HTreeGroup *pHVar10;
  int local_bc;
  int local_94;
  HTreeGroup *local_90;
  int local_74;
  uint32_t *local_58;
  uint32_t *local_50;
  uint local_38;
  int local_34;
  
  local_34 = (int)in_RDI[0x24] / in_EDX;
  local_38 = (int)in_RDI[0x24] % in_EDX;
  br_00 = (VP8LBitReader *)(in_RDI + 10);
  local_58 = (uint32_t *)(in_RSI + (long)(int)in_RDI[0x24] * 4);
  puVar8 = (uint32_t *)(in_RSI + (long)(in_EDX * in_ECX) * 4);
  puVar9 = (uint32_t *)(in_RSI + (long)(in_EDX * in_R8D) * 4);
  iVar7 = in_RDI[0x26];
  local_bc = local_34;
  if (in_RDI[0x14] == 0) {
    local_bc = 0x1000000;
  }
  local_74 = local_bc;
  if ((int)in_RDI[0x26] < 1) {
    cc = (HTreeGroup *)0x0;
  }
  else {
    cc = (HTreeGroup *)(in_RDI + 0x28);
  }
  uVar1 = in_RDI[0x30];
  pHVar10 = cc;
  local_50 = local_58;
  if (local_58 < puVar9) {
    br_01 = GetHtreeGroupForPos((VP8LMetadata *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                in_stack_ffffffffffffff18);
    local_90 = br_01;
  }
  else {
    br_01 = (HTreeGroup *)0x0;
    local_90 = br_01;
  }
LAB_00115933:
  if (puVar9 <= local_50) {
LAB_00115ebc:
    iVar7 = VP8LIsEndOfStream(br_00);
    in_RDI[0x13] = iVar7;
    if (((in_RDI[0x14] == 0) || (in_RDI[0x13] == 0)) || (puVar8 <= local_50)) {
      if (in_RDI[0x13] != 0) {
LAB_00115fcd:
        *in_RDI = 3;
        return 0;
      }
      if (in_R9 != (code *)0x0) {
        if (in_R8D < local_34) {
          local_34 = in_R8D;
        }
        (*in_R9)(in_RDI,local_34);
      }
      *in_RDI = 0;
      in_RDI[0x24] = (int)((long)local_50 - in_RSI >> 2);
    }
    else {
      RestoreState((VP8LDecoder *)0x115f11);
    }
    return 1;
  }
  if (local_74 <= local_34) {
    SaveState(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_74 = local_34 + 8;
  }
  if ((local_38 & uVar1) == 0) {
    local_90 = GetHtreeGroupForPos((VP8LMetadata *)in_stack_ffffffffffffff20,
                                   in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  }
  if (local_90->is_trivial_code == 0) {
    VP8LFillBitWindow((VP8LBitReader *)0x1159e9);
    if (local_90->use_packed_table == 0) {
      local_94 = ReadSymbol((HuffmanCode *)br_01,in_stack_ffffffffffffff28);
    }
    else {
      local_94 = ReadPackedSymbols(pHVar10,(VP8LBitReader *)br_01,
                                   (uint32_t *)in_stack_ffffffffffffff28);
      iVar2 = VP8LIsEndOfStream(br_00);
      if (iVar2 != 0) goto LAB_00115ebc;
      if (local_94 == 0) goto LAB_00115b3b;
    }
    iVar2 = VP8LIsEndOfStream(br_00);
    if (iVar2 != 0) goto LAB_00115ebc;
    if (0xff < local_94) {
      if (0x117 < local_94) {
        if (local_94 < iVar7 + 0x118) {
          while (local_58 < local_50) {
            local_58 = local_58 + 1;
            VP8LColorCacheInsert
                      ((VP8LColorCache *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          }
          uVar6 = VP8LColorCacheLookup((VP8LColorCache *)cc,local_94 - 0x118);
          *local_50 = uVar6;
          goto LAB_00115b3b;
        }
        goto LAB_00115fcd;
      }
      iVar2 = GetCopyLength((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            (VP8LBitReader *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      ReadSymbol((HuffmanCode *)br_01,in_stack_ffffffffffffff28);
      VP8LFillBitWindow((VP8LBitReader *)0x115c7b);
      iVar4 = GetCopyDistance((int)br_01,in_stack_ffffffffffffff28);
      iVar4 = PlaneCodeToDistance(in_EDX,iVar4);
      iVar5 = VP8LIsEndOfStream(br_00);
      if (iVar5 != 0) goto LAB_00115ebc;
      if (((long)local_50 - in_RSI >> 2 < (long)iVar4) ||
         ((long)puVar8 - (long)local_50 >> 2 < (long)iVar2)) goto LAB_00115fcd;
      CopyBlock32b((uint32_t *)br_01,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   (int)in_stack_ffffffffffffff28);
      local_50 = local_50 + iVar2;
      local_38 = iVar2 + local_38;
      while (in_EDX <= (int)local_38) {
        local_38 = local_38 - in_EDX;
        local_34 = local_34 + 1;
        if (((in_R9 != (code *)0x0) && (local_34 <= in_R8D)) && (local_34 % 0x10 == 0)) {
          (*in_R9)(in_RDI,local_34);
        }
      }
      if ((local_38 & uVar1) != 0) {
        local_90 = GetHtreeGroupForPos((VP8LMetadata *)in_stack_ffffffffffffff20,
                                       in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      }
      if (cc != (HTreeGroup *)0x0) {
        while (local_58 < local_50) {
          local_58 = local_58 + 1;
          VP8LColorCacheInsert
                    ((VP8LColorCache *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        }
      }
      goto LAB_00115933;
    }
    if (local_90->is_trivial_literal == 0) {
      iVar2 = ReadSymbol((HuffmanCode *)br_01,in_stack_ffffffffffffff28);
      VP8LFillBitWindow((VP8LBitReader *)0x115ac7);
      uVar3 = ReadSymbol((HuffmanCode *)br_01,in_stack_ffffffffffffff28);
      iVar4 = ReadSymbol((HuffmanCode *)br_01,in_stack_ffffffffffffff28);
      iVar5 = VP8LIsEndOfStream(br_00);
      if (iVar5 == 0) {
        *local_50 = iVar4 << 0x18 | iVar2 << 0x10 | local_94 << 8 | uVar3;
        goto LAB_00115b3b;
      }
      goto LAB_00115ebc;
    }
    *local_50 = local_90->literal_arb | local_94 << 8;
  }
  else {
    *local_50 = local_90->literal_arb;
  }
LAB_00115b3b:
  local_50 = local_50 + 1;
  local_38 = local_38 + 1;
  if (in_EDX <= (int)local_38) {
    local_38 = 0;
    local_34 = local_34 + 1;
    if (((in_R9 != (code *)0x0) && (local_34 <= in_R8D)) && (local_34 % 0x10 == 0)) {
      (*in_R9)(in_RDI,local_34);
    }
    if (cc != (HTreeGroup *)0x0) {
      while (local_58 < local_50) {
        local_58 = local_58 + 1;
        VP8LColorCacheInsert((VP8LColorCache *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
    }
  }
  goto LAB_00115933;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel_ / width;
  int col = dec->last_pixel_ % width;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* src = data + dec->last_pixel_;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size_;
  int next_sync_row = dec->incremental_ ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size_ > 0) ? &hdr->color_cache_ : NULL;
  const int mask = hdr->huffman_mask_;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row_ < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos_ = VP8LIsEndOfStream(br);
  if (dec->incremental_ && br->eos_ && src < src_end) {
    RestoreState(dec);
  } else if (!br->eos_) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status_ = VP8_STATUS_OK;
    dec->last_pixel_ = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos_=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return 0;
}